

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.cpp
# Opt level: O0

void __thiscall
basisu::basis_compressor::get_dfd(basis_compressor *this,uint8_vec *dfd,ktx2_header *header)

{
  bool bVar1;
  uint32_t uVar2;
  uchar *puVar3;
  vector<unsigned_char> *in_RSI;
  bool_param *in_RDI;
  uint32_t dfd_chan0;
  uint32_t plane_bits;
  uint32_t dfd_bits;
  uint32_t dfd_len;
  uint8_t *pDFD;
  uint32_t local_30;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar4;
  undefined1 *this_00;
  
  bVar1 = bool_param::operator_cast_to_bool(in_RDI);
  if (bVar1) {
    if (((byte)in_RDI[0x748] & 1) == 0) {
      this_00 = g_ktx2_uastc_nonalpha_dfd;
    }
    else {
      this_00 = g_ktx2_uastc_alpha_dfd;
    }
    uVar4 = 0x2c;
  }
  else if (((byte)in_RDI[0x748] & 1) == 0) {
    this_00 = g_ktx2_etc1s_nonalpha_dfd;
    uVar4 = 0x2c;
  }
  else {
    this_00 = g_ktx2_etc1s_alpha_dfd;
    uVar4 = 0x3c;
  }
  if (uVar4 < 0x2c) {
    __assert_fail("dfd_len >= 44",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp"
                  ,0x6ce,
                  "void basisu::basis_compressor::get_dfd(uint8_vec &, const basist::ktx2_header &)"
                 );
  }
  vector<unsigned_char>::resize
            ((vector<unsigned_char> *)this_00,CONCAT44(uVar4,in_stack_ffffffffffffffd8),
             SUB41((uint)in_stack_ffffffffffffffd4 >> 0x18,0));
  puVar3 = vector<unsigned_char>::data(in_RSI);
  memcpy(puVar3,this_00,(ulong)uVar4);
  puVar3 = vector<unsigned_char>::data(in_RSI);
  uVar2 = read_le_dword(puVar3 + 0xc);
  uVar4 = uVar2 & 0xff00ffff;
  bVar1 = bool_param::operator_cast_to_bool(in_RDI + 0x23c);
  if (bVar1) {
    uVar4 = uVar4 | 0x20000;
  }
  else {
    uVar4 = uVar4 | 0x10000;
  }
  puVar3 = vector<unsigned_char>::data(in_RSI);
  write_le_dword(puVar3 + 0xc,uVar4);
  uVar2 = packed_uint::operator_cast_to_unsigned_int((packed_uint<4U> *)this_00);
  if (uVar2 != 0) {
    puVar3 = vector<unsigned_char>::data(in_RSI);
    uVar2 = read_le_dword(puVar3 + 0x14);
    puVar3 = vector<unsigned_char>::data(in_RSI);
    write_le_dword(puVar3 + 0x14,uVar2 & 0xffffff00);
  }
  puVar3 = vector<unsigned_char>::data(in_RSI);
  local_30 = read_le_dword(puVar3 + 0x1c);
  bVar1 = bool_param::operator_cast_to_bool(in_RDI);
  if ((bVar1) && (local_30 = local_30 & 0xf0ffffff, ((byte)in_RDI[0x748] & 1) != 0)) {
    local_30 = local_30 | 0x3000000;
  }
  puVar3 = vector<unsigned_char>::data(in_RSI);
  write_le_dword(puVar3 + 0x1c,local_30);
  return;
}

Assistant:

void basis_compressor::get_dfd(uint8_vec &dfd, const basist::ktx2_header &header)
	{
		const uint8_t* pDFD;
		uint32_t dfd_len;

		if (m_params.m_uastc)
		{
			if (m_any_source_image_has_alpha)
			{
				pDFD = g_ktx2_uastc_alpha_dfd;
				dfd_len = sizeof(g_ktx2_uastc_alpha_dfd);
			}
			else
			{
				pDFD = g_ktx2_uastc_nonalpha_dfd;
				dfd_len = sizeof(g_ktx2_uastc_nonalpha_dfd);
			}
		}
		else
		{
			if (m_any_source_image_has_alpha)
			{
				pDFD = g_ktx2_etc1s_alpha_dfd;
				dfd_len = sizeof(g_ktx2_etc1s_alpha_dfd);
			}
			else
			{
				pDFD = g_ktx2_etc1s_nonalpha_dfd;
				dfd_len = sizeof(g_ktx2_etc1s_nonalpha_dfd);
			}
		}
				
		assert(dfd_len >= 44);

		dfd.resize(dfd_len);
		memcpy(dfd.data(), pDFD, dfd_len);

		uint32_t dfd_bits = basisu::read_le_dword(dfd.data() + 3 * sizeof(uint32_t));
		
		dfd_bits &= ~(0xFF << 16);

		if (m_params.m_ktx2_srgb_transfer_func)
			dfd_bits |= (basist::KTX2_KHR_DF_TRANSFER_SRGB << 16);
		else
			dfd_bits |= (basist::KTX2_KHR_DF_TRANSFER_LINEAR << 16);

		basisu::write_le_dword(dfd.data() + 3 * sizeof(uint32_t), dfd_bits);

		if (header.m_supercompression_scheme != basist::KTX2_SS_NONE)
		{
			uint32_t plane_bits = basisu::read_le_dword(dfd.data() + 5 * sizeof(uint32_t));

			plane_bits &= ~0xFF;

			basisu::write_le_dword(dfd.data() + 5 * sizeof(uint32_t), plane_bits);
		}

		// Fix up the DFD channel(s)
		uint32_t dfd_chan0 = basisu::read_le_dword(dfd.data() + 7 * sizeof(uint32_t));

		if (m_params.m_uastc)
		{
			dfd_chan0 &= ~(0xF << 24);
			
			// TODO: Allow the caller to override this
			if (m_any_source_image_has_alpha)
				dfd_chan0 |= (basist::KTX2_DF_CHANNEL_UASTC_RGBA << 24);
			else
				dfd_chan0 |= (basist::KTX2_DF_CHANNEL_UASTC_RGB << 24);
		}

		basisu::write_le_dword(dfd.data() + 7 * sizeof(uint32_t), dfd_chan0);
	}